

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O1

void MCInst_insert0(MCInst *inst,int index,MCOperand *Op)

{
  MCInst *pMVar1;
  MCOperand *pMVar2;
  byte bVar3;
  anon_union_8_3_2f11d3b5_for_MCOperand_3 aVar4;
  uint8_t uVar5;
  _Bool _Var6;
  uint8_t uVar7;
  undefined1 uVar8;
  uchar uVar9;
  undefined3 uVar10;
  ulong uVar11;
  MCInst *pMVar12;
  
  bVar3 = inst->size;
  uVar11 = (ulong)bVar3;
  if (index < (int)(uint)bVar3) {
    pMVar12 = (MCInst *)(inst->Operands + bVar3);
    do {
      uVar11 = uVar11 - 1;
      pMVar1 = (MCInst *)((long)(pMVar12 + 0xffffffffffffffff) + 800);
      uVar5 = pMVar1->size;
      _Var6 = pMVar1->has_imm;
      uVar7 = pMVar1->op1_size;
      uVar8 = pMVar1->field_0x7;
      aVar4 = *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)
               ((long)(pMVar12 + 0xffffffffffffffff) + 0x328);
      pMVar12->OpcodePub = pMVar1->OpcodePub;
      pMVar12->size = uVar5;
      pMVar12->has_imm = _Var6;
      pMVar12->op1_size = uVar7;
      pMVar12->field_0x7 = uVar8;
      *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)&pMVar12->Opcode = aVar4;
      pMVar12 = (MCInst *)((long)(pMVar12 + 0xffffffffffffffff) + 800);
    } while ((long)index < (long)uVar11);
  }
  uVar9 = Op->Kind;
  uVar10 = *(undefined3 *)&Op->field_0x5;
  aVar4 = Op->field_2;
  pMVar2 = inst->Operands + index;
  pMVar2->MachineOperandType = Op->MachineOperandType;
  pMVar2->Kind = uVar9;
  *(undefined3 *)&pMVar2->field_0x5 = uVar10;
  pMVar2->field_2 = aVar4;
  inst->size = inst->size + '\x01';
  return;
}

Assistant:

void MCInst_insert0(MCInst *inst, int index, MCOperand *Op)
{
	int i;

	for(i = inst->size; i > index; i--)
		//memcpy(&(inst->Operands[i]), &(inst->Operands[i-1]), sizeof(MCOperand));
		inst->Operands[i] = inst->Operands[i-1];

	inst->Operands[index] = *Op;
	inst->size++;
}